

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_read_increment
                 (BitReadCtx_t *gbc,RK_U32 range_min,RK_U32 range_max,char *name,RK_U32 *write_to)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  int iVar3;
  RK_S32 _out;
  char local_3c [4];
  uint *local_38;
  
  local_38 = write_to;
  if (range_max < range_min || 0x1f < range_max - range_min) {
    _mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
               "range_min <= range_max && range_max - range_min < sizeof(bits) - 1",
               "mpp_av1_read_increment",0x90);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  do {
    if (range_max <= range_min) goto LAB_001c8099;
    RVar1 = mpp_get_bits_left(gbc);
    if (RVar1 < 1) {
      _mpp_log_l(2,"av1d_cbs","Invalid increment value at %s: bitstream ended.\n",
                 "mpp_av1_read_increment",name);
      iVar3 = 1;
    }
    else {
      MVar2 = mpp_read_bits(gbc,1,(RK_S32 *)local_3c);
      gbc->ret = MVar2;
      if (MVar2 == MPP_OK) {
        iVar3 = 6;
        if (local_3c[0] != '\0') {
          iVar3 = 0;
        }
        range_min = range_min + (local_3c[0] != '\0');
      }
      else {
        iVar3 = 10;
      }
    }
  } while (iVar3 == 0);
  if (iVar3 == 6) {
LAB_001c8099:
    *local_38 = range_min;
    RVar1 = 0;
  }
  else {
    RVar1 = -1;
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_read_increment(BitReadCtx_t *gbc, RK_U32 range_min,
                                     RK_U32 range_max, const char *name,
                                     RK_U32 *write_to)
{
    RK_U32 value;
    RK_S32 i;
    RK_S8 bits[33];

    mpp_assert(range_min <= range_max && range_max - range_min < sizeof(bits) - 1);

    for (i = 0, value = range_min; value < range_max;) {
        RK_U8 tmp = 0;
        if (mpp_get_bits_left(gbc) < 1) {
            mpp_err_f("Invalid increment value at "
                      "%s: bitstream ended.\n", name);
            return MPP_NOK;
        }
        READ_ONEBIT(gbc, &tmp);
        if (tmp) {
            bits[i++] = '1';
            ++value;
        } else {
            bits[i++] = '0';
            break;
        }
    }
    *write_to = value;
    return MPP_OK;

__bitread_error:
    return MPP_NOK;
}